

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O0

mnist_model *
mnist_model_init_from_file(string *fname,string *backend,int nbatch_logical,int nbatch_physical)

{
  ggml_context *pgVar1;
  bool bVar2;
  undefined8 uVar3;
  long lVar4;
  char *pcVar5;
  reference ppgVar6;
  ggml_backend_buffer_t pgVar7;
  ggml_tensor *pgVar8;
  mnist_model *in_RDI;
  int in_stack_000000c0;
  int in_stack_000000c4;
  string *in_stack_000000c8;
  mnist_model *in_stack_000000d0;
  gguf_init_params params;
  gguf_context *ctx;
  mnist_model *model;
  char *in_stack_fffffffffffffea8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffeb0;
  FILE *pFVar9;
  ggml_tensor *in_stack_ffffffffffffff08;
  ggml_tensor *in_stack_ffffffffffffff10;
  ggml_tensor *in_stack_ffffffffffffff18;
  
  mnist_model::mnist_model(in_stack_000000d0,in_stack_000000c8,in_stack_000000c4,in_stack_000000c0);
  pFVar9 = _stderr;
  uVar3 = std::__cxx11::string::c_str();
  fprintf(pFVar9,"%s: loading model weights from \'%s\'\n","mnist_model_init_from_file",uVar3);
  uVar3 = std::__cxx11::string::c_str();
  lVar4 = gguf_init_from_file(uVar3,1,&in_RDI->ctx_gguf);
  if (lVar4 == 0) {
    fprintf(_stderr,"%s: gguf_init_from_file() failed\n","mnist_model_init_from_file");
    exit(1);
  }
  uVar3 = gguf_find_key(lVar4,"general.architecture");
  pcVar5 = (char *)gguf_get_val_str(lVar4,uVar3);
  std::__cxx11::string::operator=((string *)in_RDI,pcVar5);
  pFVar9 = _stderr;
  uVar3 = std::__cxx11::string::c_str();
  fprintf(pFVar9,"%s: model arch is %s\n","mnist_model_init_from_file",uVar3);
  bVar2 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  if (bVar2) {
    pgVar8 = (ggml_tensor *)ggml_get_tensor(in_RDI->ctx_gguf,"fc1.weight");
    in_RDI->fc1_weight = pgVar8;
    if (in_RDI->fc1_weight->ne[0] != 0x310) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0x98,"GGML_ASSERT(%s) failed","model.fc1_weight->ne[0] == MNIST_NINPUT");
    }
    if (in_RDI->fc1_weight->ne[1] != 500) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0x99,"GGML_ASSERT(%s) failed","model.fc1_weight->ne[1] == MNIST_NHIDDEN");
    }
    if (in_RDI->fc1_weight->ne[2] != 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0x9a,"GGML_ASSERT(%s) failed","model.fc1_weight->ne[2] == 1");
    }
    if (in_RDI->fc1_weight->ne[3] != 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0x9b,"GGML_ASSERT(%s) failed","model.fc1_weight->ne[3] == 1");
    }
    pgVar8 = (ggml_tensor *)ggml_get_tensor(in_RDI->ctx_gguf,"fc1.bias");
    in_RDI->fc1_bias = pgVar8;
    if (in_RDI->fc1_bias->ne[0] != 500) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0x9e,"GGML_ASSERT(%s) failed","model.fc1_bias->ne[0] == MNIST_NHIDDEN");
    }
    if (in_RDI->fc1_bias->ne[1] != 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0x9f,"GGML_ASSERT(%s) failed","model.fc1_bias->ne[1] == 1");
    }
    if (in_RDI->fc1_bias->ne[2] != 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0xa0,"GGML_ASSERT(%s) failed","model.fc1_bias->ne[2] == 1");
    }
    if (in_RDI->fc1_bias->ne[3] != 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0xa1,"GGML_ASSERT(%s) failed","model.fc1_bias->ne[3] == 1");
    }
    pgVar8 = (ggml_tensor *)ggml_get_tensor(in_RDI->ctx_gguf,"fc2.weight");
    in_RDI->fc2_weight = pgVar8;
    if (in_RDI->fc2_weight->ne[0] != 500) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0xa4,"GGML_ASSERT(%s) failed","model.fc2_weight->ne[0] == MNIST_NHIDDEN");
    }
    if (in_RDI->fc2_weight->ne[1] != 10) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0xa5,"GGML_ASSERT(%s) failed","model.fc2_weight->ne[1] == MNIST_NCLASSES");
    }
    if (in_RDI->fc2_weight->ne[2] != 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0xa6,"GGML_ASSERT(%s) failed","model.fc2_weight->ne[2] == 1");
    }
    if (in_RDI->fc2_weight->ne[3] != 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0xa7,"GGML_ASSERT(%s) failed","model.fc2_weight->ne[3] == 1");
    }
    pgVar8 = (ggml_tensor *)ggml_get_tensor(in_RDI->ctx_gguf,"fc2.bias");
    in_RDI->fc2_bias = pgVar8;
    if (in_RDI->fc2_bias->ne[0] != 10) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0xaa,"GGML_ASSERT(%s) failed","model.fc2_bias->ne[0] == MNIST_NCLASSES");
    }
    if (in_RDI->fc2_bias->ne[1] != 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0xab,"GGML_ASSERT(%s) failed","model.fc2_bias->ne[1] == 1");
    }
    if (in_RDI->fc2_bias->ne[2] != 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0xac,"GGML_ASSERT(%s) failed","model.fc2_bias->ne[2] == 1");
    }
    if (in_RDI->fc2_bias->ne[3] != 1) {
      ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                 ,0xad,"GGML_ASSERT(%s) failed","model.fc2_bias->ne[3] == 1");
    }
  }
  else {
    bVar2 = std::operator==(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    pFVar9 = _stderr;
    if (bVar2) {
      pgVar8 = (ggml_tensor *)ggml_get_tensor(in_RDI->ctx_gguf,"conv1.kernel");
      in_RDI->conv1_kernel = pgVar8;
      if (in_RDI->conv1_kernel->type != GGML_TYPE_F32) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xb0,"GGML_ASSERT(%s) failed","model.conv1_kernel->type == GGML_TYPE_F32");
      }
      if (in_RDI->conv1_kernel->ne[0] != 3) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xb1,"GGML_ASSERT(%s) failed","model.conv1_kernel->ne[0] == 3");
      }
      if (in_RDI->conv1_kernel->ne[1] != 3) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xb2,"GGML_ASSERT(%s) failed","model.conv1_kernel->ne[1] == 3");
      }
      if (in_RDI->conv1_kernel->ne[2] != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xb3,"GGML_ASSERT(%s) failed","model.conv1_kernel->ne[2] == 1");
      }
      if (in_RDI->conv1_kernel->ne[3] != 8) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xb4,"GGML_ASSERT(%s) failed","model.conv1_kernel->ne[3] == MNIST_CNN_NCB");
      }
      in_stack_ffffffffffffff18 = (ggml_tensor *)ggml_get_tensor(in_RDI->ctx_gguf,"conv1.bias");
      in_RDI->conv1_bias = in_stack_ffffffffffffff18;
      if (in_RDI->conv1_bias->type != GGML_TYPE_F32) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xb7,"GGML_ASSERT(%s) failed","model.conv1_bias->type == GGML_TYPE_F32");
      }
      if (in_RDI->conv1_bias->ne[0] != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xb8,"GGML_ASSERT(%s) failed","model.conv1_bias->ne[0] == 1");
      }
      if (in_RDI->conv1_bias->ne[1] != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xb9,"GGML_ASSERT(%s) failed","model.conv1_bias->ne[1] == 1");
      }
      if (in_RDI->conv1_bias->ne[2] != 8) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xba,"GGML_ASSERT(%s) failed","model.conv1_bias->ne[2] == MNIST_CNN_NCB");
      }
      if (in_RDI->conv1_bias->ne[3] != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xbb,"GGML_ASSERT(%s) failed","model.conv1_bias->ne[3] == 1");
      }
      in_stack_ffffffffffffff10 = (ggml_tensor *)ggml_get_tensor(in_RDI->ctx_gguf,"conv2.kernel");
      in_RDI->conv2_kernel = in_stack_ffffffffffffff10;
      if (in_RDI->conv2_kernel->type != GGML_TYPE_F32) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xbe,"GGML_ASSERT(%s) failed","model.conv2_kernel->type == GGML_TYPE_F32");
      }
      if (in_RDI->conv2_kernel->ne[0] != 3) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xbf,"GGML_ASSERT(%s) failed","model.conv2_kernel->ne[0] == 3");
      }
      if (in_RDI->conv2_kernel->ne[1] != 3) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xc0,"GGML_ASSERT(%s) failed","model.conv2_kernel->ne[1] == 3");
      }
      if (in_RDI->conv2_kernel->ne[2] != 8) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xc1,"GGML_ASSERT(%s) failed","model.conv2_kernel->ne[2] == MNIST_CNN_NCB");
      }
      if (in_RDI->conv2_kernel->ne[3] != 0x10) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xc2,"GGML_ASSERT(%s) failed","model.conv2_kernel->ne[3] == MNIST_CNN_NCB*2");
      }
      in_stack_ffffffffffffff08 = (ggml_tensor *)ggml_get_tensor(in_RDI->ctx_gguf,"conv2.bias");
      in_RDI->conv2_bias = in_stack_ffffffffffffff08;
      if (in_RDI->conv2_bias->type != GGML_TYPE_F32) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xc5,"GGML_ASSERT(%s) failed","model.conv2_bias->type == GGML_TYPE_F32");
      }
      if (in_RDI->conv2_bias->ne[0] != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xc6,"GGML_ASSERT(%s) failed","model.conv2_bias->ne[0] == 1");
      }
      if (in_RDI->conv2_bias->ne[1] != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,199,"GGML_ASSERT(%s) failed","model.conv2_bias->ne[1] == 1");
      }
      if (in_RDI->conv2_bias->ne[2] != 0x10) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,200,"GGML_ASSERT(%s) failed","model.conv2_bias->ne[2] == MNIST_CNN_NCB*2");
      }
      if (in_RDI->conv2_bias->ne[3] != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xc9,"GGML_ASSERT(%s) failed","model.conv2_bias->ne[3] == 1");
      }
      pgVar8 = (ggml_tensor *)ggml_get_tensor(in_RDI->ctx_gguf,"dense.weight");
      in_RDI->dense_weight = pgVar8;
      if (in_RDI->dense_weight->type != GGML_TYPE_F32) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xcc,"GGML_ASSERT(%s) failed","model.dense_weight->type == GGML_TYPE_F32");
      }
      if (in_RDI->dense_weight->ne[0] != 0x310) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xcd,"GGML_ASSERT(%s) failed",
                   "model.dense_weight->ne[0] == (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2)");
      }
      if (in_RDI->dense_weight->ne[1] != 10) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xce,"GGML_ASSERT(%s) failed","model.dense_weight->ne[1] == MNIST_NCLASSES");
      }
      if (in_RDI->dense_weight->ne[2] != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xcf,"GGML_ASSERT(%s) failed","model.dense_weight->ne[2] == 1");
      }
      if (in_RDI->dense_weight->ne[3] != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xd0,"GGML_ASSERT(%s) failed","model.dense_weight->ne[3] == 1");
      }
      pgVar8 = (ggml_tensor *)ggml_get_tensor(in_RDI->ctx_gguf,"dense.bias");
      in_RDI->dense_bias = pgVar8;
      if (in_RDI->dense_bias->type != GGML_TYPE_F32) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xd3,"GGML_ASSERT(%s) failed","model.dense_bias->type == GGML_TYPE_F32");
      }
      if (in_RDI->dense_bias->ne[0] != 10) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xd4,"GGML_ASSERT(%s) failed","model.dense_bias->ne[0] == MNIST_NCLASSES");
      }
      if (in_RDI->dense_bias->ne[1] != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xd5,"GGML_ASSERT(%s) failed","model.dense_bias->ne[1] == 1");
      }
      if (in_RDI->dense_bias->ne[2] != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xd6,"GGML_ASSERT(%s) failed","model.dense_bias->ne[2] == 1");
      }
      if (in_RDI->dense_bias->ne[3] != 1) {
        ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/examples/mnist/mnist-common.cpp"
                   ,0xd7,"GGML_ASSERT(%s) failed","model.dense_bias->ne[3] == 1");
      }
    }
    else {
      uVar3 = std::__cxx11::string::c_str();
      fprintf(pFVar9,"%s: unknown model arch: %s\n","mnist_model_init_from_file",uVar3);
    }
  }
  pgVar1 = in_RDI->ctx_gguf;
  ppgVar6 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::operator[]
                      (&in_RDI->backends,0);
  pgVar7 = (ggml_backend_buffer_t)ggml_backend_alloc_ctx_tensors(pgVar1,*ppgVar6);
  in_RDI->buf_gguf = pgVar7;
  std::__cxx11::string::c_str();
  bVar2 = load_from_gguf((char *)in_stack_ffffffffffffff18,(ggml_context *)in_stack_ffffffffffffff10
                         ,(gguf_context *)in_stack_ffffffffffffff08);
  if (!bVar2) {
    pFVar9 = _stderr;
    uVar3 = std::__cxx11::string::c_str();
    fprintf(pFVar9,"%s: loading weights from %s failed\n","mnist_model_init_from_file",uVar3);
    exit(1);
  }
  pgVar8 = (ggml_tensor *)ggml_new_tensor_2d(in_RDI->ctx_static,0,0x310,500);
  in_RDI->images = pgVar8;
  ggml_set_name(in_RDI->images,"images");
  ggml_set_input(in_RDI->images);
  pgVar1 = in_RDI->ctx_static;
  ppgVar6 = std::vector<ggml_backend_*,_std::allocator<ggml_backend_*>_>::operator[]
                      (&in_RDI->backends,0);
  pgVar7 = (ggml_backend_buffer_t)ggml_backend_alloc_ctx_tensors(pgVar1,*ppgVar6);
  in_RDI->buf_static = pgVar7;
  pFVar9 = _stderr;
  uVar3 = std::__cxx11::string::c_str();
  fprintf(pFVar9,"%s: successfully loaded weights from %s\n","mnist_model_init_from_file",uVar3);
  return in_RDI;
}

Assistant:

mnist_model mnist_model_init_from_file(const std::string & fname, const std::string & backend, const int nbatch_logical, const int nbatch_physical) {
    mnist_model model(backend, nbatch_logical, nbatch_physical);
    fprintf(stderr, "%s: loading model weights from '%s'\n", __func__, fname.c_str());

    struct gguf_context * ctx;
    {
        struct gguf_init_params params = {
            /*.no_alloc   =*/ true,
            /*.ctx        =*/ &model.ctx_gguf,
        };
        ctx = gguf_init_from_file(fname.c_str(), params);
        if (!ctx) {
            fprintf(stderr, "%s: gguf_init_from_file() failed\n", __func__);
            exit(1);
        }
    }
    model.arch = gguf_get_val_str(ctx, gguf_find_key(ctx, "general.architecture"));
    fprintf(stderr, "%s: model arch is %s\n", __func__, model.arch.c_str());

    if (model.arch == "mnist-fc") {
        model.fc1_weight = ggml_get_tensor(model.ctx_gguf, "fc1.weight");
        GGML_ASSERT(model.fc1_weight->ne[0] == MNIST_NINPUT);
        GGML_ASSERT(model.fc1_weight->ne[1] == MNIST_NHIDDEN);
        GGML_ASSERT(model.fc1_weight->ne[2] == 1);
        GGML_ASSERT(model.fc1_weight->ne[3] == 1);

        model.fc1_bias = ggml_get_tensor(model.ctx_gguf, "fc1.bias");
        GGML_ASSERT(model.fc1_bias->ne[0] == MNIST_NHIDDEN);
        GGML_ASSERT(model.fc1_bias->ne[1] == 1);
        GGML_ASSERT(model.fc1_bias->ne[2] == 1);
        GGML_ASSERT(model.fc1_bias->ne[3] == 1);

        model.fc2_weight = ggml_get_tensor(model.ctx_gguf, "fc2.weight");
        GGML_ASSERT(model.fc2_weight->ne[0] == MNIST_NHIDDEN);
        GGML_ASSERT(model.fc2_weight->ne[1] == MNIST_NCLASSES);
        GGML_ASSERT(model.fc2_weight->ne[2] == 1);
        GGML_ASSERT(model.fc2_weight->ne[3] == 1);

        model.fc2_bias = ggml_get_tensor(model.ctx_gguf, "fc2.bias");
        GGML_ASSERT(model.fc2_bias->ne[0] == MNIST_NCLASSES);
        GGML_ASSERT(model.fc2_bias->ne[1] == 1);
        GGML_ASSERT(model.fc2_bias->ne[2] == 1);
        GGML_ASSERT(model.fc2_bias->ne[3] == 1);
    } else if (model.arch == "mnist-cnn") {
        model.conv1_kernel = ggml_get_tensor(model.ctx_gguf, "conv1.kernel");
        GGML_ASSERT(model.conv1_kernel->type == GGML_TYPE_F32);
        GGML_ASSERT(model.conv1_kernel->ne[0] == 3);
        GGML_ASSERT(model.conv1_kernel->ne[1] == 3);
        GGML_ASSERT(model.conv1_kernel->ne[2] == 1);
        GGML_ASSERT(model.conv1_kernel->ne[3] == MNIST_CNN_NCB);

        model.conv1_bias = ggml_get_tensor(model.ctx_gguf, "conv1.bias");
        GGML_ASSERT(model.conv1_bias->type == GGML_TYPE_F32);
        GGML_ASSERT(model.conv1_bias->ne[0] == 1);
        GGML_ASSERT(model.conv1_bias->ne[1] == 1);
        GGML_ASSERT(model.conv1_bias->ne[2] == MNIST_CNN_NCB);
        GGML_ASSERT(model.conv1_bias->ne[3] == 1);

        model.conv2_kernel = ggml_get_tensor(model.ctx_gguf, "conv2.kernel");
        GGML_ASSERT(model.conv2_kernel->type == GGML_TYPE_F32);
        GGML_ASSERT(model.conv2_kernel->ne[0] == 3);
        GGML_ASSERT(model.conv2_kernel->ne[1] == 3);
        GGML_ASSERT(model.conv2_kernel->ne[2] == MNIST_CNN_NCB);
        GGML_ASSERT(model.conv2_kernel->ne[3] == MNIST_CNN_NCB*2);

        model.conv2_bias = ggml_get_tensor(model.ctx_gguf, "conv2.bias");
        GGML_ASSERT(model.conv2_bias->type == GGML_TYPE_F32);
        GGML_ASSERT(model.conv2_bias->ne[0] == 1);
        GGML_ASSERT(model.conv2_bias->ne[1] == 1);
        GGML_ASSERT(model.conv2_bias->ne[2] == MNIST_CNN_NCB*2);
        GGML_ASSERT(model.conv2_bias->ne[3] == 1);

        model.dense_weight = ggml_get_tensor(model.ctx_gguf, "dense.weight");
        GGML_ASSERT(model.dense_weight->type == GGML_TYPE_F32);
        GGML_ASSERT(model.dense_weight->ne[0] == (MNIST_HW/4)*(MNIST_HW/4)*(MNIST_CNN_NCB*2));
        GGML_ASSERT(model.dense_weight->ne[1] == MNIST_NCLASSES);
        GGML_ASSERT(model.dense_weight->ne[2] == 1);
        GGML_ASSERT(model.dense_weight->ne[3] == 1);

        model.dense_bias = ggml_get_tensor(model.ctx_gguf, "dense.bias");
        GGML_ASSERT(model.dense_bias->type == GGML_TYPE_F32);
        GGML_ASSERT(model.dense_bias->ne[0] == MNIST_NCLASSES);
        GGML_ASSERT(model.dense_bias->ne[1] == 1);
        GGML_ASSERT(model.dense_bias->ne[2] == 1);
        GGML_ASSERT(model.dense_bias->ne[3] == 1);
    } else {
        fprintf(stderr, "%s: unknown model arch: %s\n", __func__, model.arch.c_str());
    }

    model.buf_gguf = ggml_backend_alloc_ctx_tensors(model.ctx_gguf, model.backends[0]);

    if(!load_from_gguf(fname.c_str(), model.ctx_gguf, ctx)) {
        fprintf(stderr, "%s: loading weights from %s failed\n", __func__, fname.c_str());
        exit(1);
    }

    // The space in ctx_gguf exactly fits the model weights,
    // the images (which also need to be statically allocated) need to be put in a different context.

    model.images = ggml_new_tensor_2d(model.ctx_static, GGML_TYPE_F32, MNIST_NINPUT, MNIST_NBATCH_PHYSICAL);
    ggml_set_name(model.images, "images");
    ggml_set_input(model.images);

    model.buf_static = ggml_backend_alloc_ctx_tensors(model.ctx_static, model.backends[0]);

    fprintf(stderr, "%s: successfully loaded weights from %s\n", __func__, fname.c_str());
    return model;
}